

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

void * spng_get_png_buffer(spng_ctx *ctx,size_t *len,int *error)

{
  int *local_38;
  int local_2c;
  int *piStack_28;
  int tmp;
  int *error_local;
  size_t *len_local;
  spng_ctx *ctx_local;
  
  local_38 = error;
  if (error == (int *)0x0) {
    local_38 = &local_2c;
  }
  piStack_28 = local_38;
  error_local = (int *)len;
  len_local = &ctx->data_size;
  *local_38 = 0;
  if ((len_local == (size_t *)0x0) || (error_local == (int *)0x0)) {
    *piStack_28 = 1;
  }
  if (*piStack_28 == 0) {
    if ((*(ushort *)((long)len_local + 0xcc) >> 4 & 1) == 0) {
      *piStack_28 = 0x51;
    }
    else if ((int)len_local[0x19] == 0) {
      *piStack_28 = 0x46;
    }
    else if ((*(ushort *)((long)len_local + 0xcc) >> 1 & 1) == 0) {
      *piStack_28 = 0x54;
    }
    else if ((uint)len_local[0x19] < 6) {
      *piStack_28 = 0x54;
    }
    else if ((int)len_local[0x19] != 9) {
      *piStack_28 = 0x55;
    }
    if (*piStack_28 == 0) {
      *(undefined4 *)(len_local + 0xb) = 1;
      *(size_t *)error_local = len_local[0xf];
      ctx_local = (spng_ctx *)len_local[0xc];
    }
    else {
      ctx_local = (spng_ctx *)0x0;
    }
  }
  else {
    ctx_local = (spng_ctx *)0x0;
  }
  return ctx_local;
}

Assistant:

void *spng_get_png_buffer(spng_ctx *ctx, size_t *len, int *error)
{
    int tmp = 0;
    error = error ? error : &tmp;
    *error = 0;

    if(ctx == NULL || !len) *error = SPNG_EINVAL;

    if(*error) return NULL;

    if(!ctx->encode_only) *error = SPNG_ECTXTYPE;
    else if(!ctx->state) *error = SPNG_EBADSTATE;
    else if(!ctx->internal_buffer) *error = SPNG_EOPSTATE;
    else if(ctx->state < SPNG_STATE_EOI) *error = SPNG_EOPSTATE;
    else if(ctx->state != SPNG_STATE_IEND) *error = SPNG_ENOTFINAL;

    if(*error) return NULL;

    ctx->user_owns_out_png = 1;

    *len = ctx->bytes_encoded;

    return ctx->out_png;
}